

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O0

double __thiscall agg::bspline::get_stateful(bspline *this,double x)

{
  uint uVar1;
  size_t sVar2;
  __compar_fn_t in_R8;
  double x_local;
  bspline *this_local;
  
  if (this->m_num < 3) {
    this_local = (bspline *)0x0;
  }
  else if (*this->m_x <= x) {
    sVar2 = (size_t)(this->m_num + -1);
    if (x < this->m_x[sVar2]) {
      if (this->m_last_idx < 0) {
        bsearch((void *)(ulong)(uint)this->m_num,this->m_x,(size_t)&this->m_last_idx,sVar2,in_R8);
        this_local = (bspline *)interpolation(this,x,this->m_last_idx);
      }
      else {
        if ((x < this->m_x[this->m_last_idx]) ||
           (this->m_x[this->m_last_idx + 1] <= x && x != this->m_x[this->m_last_idx + 1])) {
          uVar1 = this->m_num - 2;
          sVar2 = (size_t)uVar1;
          if (((int)uVar1 <= this->m_last_idx) ||
             ((sVar2 = (size_t)(this->m_last_idx + 1), x < this->m_x[sVar2] ||
              (sVar2 = (size_t)(this->m_last_idx + 2), this->m_x[sVar2] < x)))) {
            if ((this->m_last_idx < 1) ||
               ((sVar2 = (size_t)(this->m_last_idx + -1), x < this->m_x[sVar2] ||
                (sVar2 = (size_t)this->m_last_idx, this->m_x[sVar2] < x)))) {
              bsearch((void *)(ulong)(uint)this->m_num,this->m_x,(size_t)&this->m_last_idx,sVar2,
                      in_R8);
            }
            else {
              this->m_last_idx = this->m_last_idx + -1;
            }
          }
          else {
            this->m_last_idx = this->m_last_idx + 1;
          }
        }
        this_local = (bspline *)interpolation(this,x,this->m_last_idx);
      }
    }
    else {
      this_local = (bspline *)extrapolation_right(this,x);
    }
  }
  else {
    this_local = (bspline *)extrapolation_left(this,x);
  }
  return (double)this_local;
}

Assistant:

double bspline::get_stateful(double x) const
    {
        if(m_num > 2)
        {
            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            if(m_last_idx >= 0)
            {
                // Check if x is not in current range
                if(x < m_x[m_last_idx] || x > m_x[m_last_idx + 1])
                {
                    // Check if x between next points (most probably)
                    if(m_last_idx < m_num - 2 && 
                       x >= m_x[m_last_idx + 1] &&
                       x <= m_x[m_last_idx + 2])
                    {
                        ++m_last_idx;
                    }
                    else
                    if(m_last_idx > 0 && 
                       x >= m_x[m_last_idx - 1] && 
                       x <= m_x[m_last_idx])
                    {
                        // x is between pevious points
                        --m_last_idx;
                    }
                    else
                    {
                        // Else perform full search
                        bsearch(m_num, m_x, x, &m_last_idx);
                    }
                }
                return interpolation(x, m_last_idx);
            }
            else
            {
                // Interpolation
                bsearch(m_num, m_x, x, &m_last_idx);
                return interpolation(x, m_last_idx);
            }
        }
        return 0.0;
    }